

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_stats.hpp
# Opt level: O0

void __thiscall
so_5::disp::reuse::thread_pool_stats::data_source_t::collector_t::~collector_t(collector_t *this)

{
  bool bVar1;
  queue_description_holder_t *pqVar2;
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t> local_20;
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t> current;
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t> holder;
  collector_t *this_local;
  
  (this->super_stats_consumer_t)._vptr_stats_consumer_t =
       (_func_int **)&PTR_set_thread_count_005c4cd8;
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::intrusive_ptr_t
            (&current,&this->m_queue_desc_head);
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::reset
            (&this->m_queue_desc_head);
  while( true ) {
    bVar1 = so_5::intrusive_ptr_t::operator_cast_to_bool((intrusive_ptr_t *)&current);
    if (!bVar1) break;
    intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::
    intrusive_ptr_t(&local_20,&current);
    pqVar2 = intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::
             operator->(&current);
    intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::operator=
              (&current,&pqVar2->m_next);
    pqVar2 = intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::
             operator->(&local_20);
    intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::reset
              (&pqVar2->m_next);
    intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::
    ~intrusive_ptr_t(&local_20);
  }
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::reset
            (&this->m_queue_desc_tail);
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::
  ~intrusive_ptr_t(&current);
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::
  ~intrusive_ptr_t(&this->m_queue_desc_tail);
  intrusive_ptr_t<so_5::disp::reuse::thread_pool_stats::queue_description_holder_t>::
  ~intrusive_ptr_t(&this->m_queue_desc_head);
  stats_consumer_t::~stats_consumer_t(&this->super_stats_consumer_t);
  return;
}

Assistant:

~collector_t()
					{
						// Chain of queue data sources must be cleaned up.
						auto holder = m_queue_desc_head;
						m_queue_desc_head.reset();

						while( holder )
							{
								auto current = holder;
								holder = holder->m_next;
								current->m_next.reset();
							}

						m_queue_desc_tail.reset();
					}